

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LoadFuncExpression(Lowerer *this,Instr *instrFuncExpr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Opnd *this_00;
  
  bVar2 = Func::IsInlinee(instrFuncExpr->m_func);
  if ((instrFuncExpr->m_func == this->m_func) == bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x356b,
                       "(instrFuncExpr->m_func->IsInlinee() ? (instrFuncExpr->m_func != this->m_func) : (instrFuncExpr->m_func == this->m_func))"
                       ,
                       "instrFuncExpr->m_func->IsInlinee() ? (instrFuncExpr->m_func != this->m_func) : (instrFuncExpr->m_func == this->m_func)"
                      );
    if (!bVar2) goto LAB_005b937d;
    *puVar4 = 0;
  }
  this_00 = GetFuncObjectOpnd(this,instrFuncExpr);
  if (instrFuncExpr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005b937d;
    *puVar4 = 0;
  }
  func = instrFuncExpr->m_func;
  if (this_00->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005b937d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = this_00->field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = IR::Opnd::Copy(this_00,func);
    bVar3 = this_00->field_0xb;
  }
  this_00->field_0xb = bVar3 | 2;
  instrFuncExpr->m_src1 = this_00;
  LowererMD::ChangeToAssign(instrFuncExpr);
  return instrFuncExpr;
}

Assistant:

IR::Instr *
Lowerer::LoadFuncExpression(IR::Instr *instrFuncExpr)
{
    ASSERT_INLINEE_FUNC(instrFuncExpr);
    IR::Opnd *paramOpnd = GetFuncObjectOpnd(instrFuncExpr);

    // mov dst, param
    instrFuncExpr->SetSrc1(paramOpnd);
    LowererMD::ChangeToAssign(instrFuncExpr);

    return instrFuncExpr;
}